

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O0

Str * __thiscall
mbc::Val::MessageBook::fullID(Str *__return_storage_ptr__,MessageBook *this,Str *ID)

{
  bool bVar1;
  reference pbVar2;
  string *psVar3;
  bad_ID *this_00;
  string local_70;
  string local_50;
  _Self local_30;
  _Self local_28;
  iterator it;
  Str *ID_local;
  MessageBook *this_local;
  Str *result;
  
  it._M_node = (_List_node_base *)ID;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(this->order_);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this->order_);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      this_00 = (bad_ID *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      bad_ID::bad_ID(this_00);
      __cxa_throw(this_00,&bad_ID::typeinfo,bad_ID::~bad_ID);
    }
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar2);
    psVar3 = Str::raw_abi_cxx11_(ID);
    std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
    bVar1 = units::start_with(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) break;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  Str::Str(__return_storage_ptr__);
  pbVar2 = std::
           _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_28);
  _ValAtom::set(&__return_storage_ptr__->super__ValAtom,pbVar2);
  return __return_storage_ptr__;
}

Assistant:

Str MessageBook::fullID(Str ID) {
    for(auto it = order_ -> begin(); it != order_ -> end(); ++it) {
        if (units::start_with(*it, ID.raw())) {
            Str result;
            result.set(*it);
            return result;
        }
    }
    throw bad_ID();
}